

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

void matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
               (Id<mathiu::impl::Pair> *idPat,int32_t depth,IdProcess idProcess)

{
  IdBlockBase<mathiu::impl::Pair> *pIVar1;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_a;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_9;
  
  if (idProcess == kCONFIRM) {
    pIVar1 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                        (&local_9,&idPat->mBlock)->super_IdBlockBase<mathiu::impl::Pair>;
    IdBlockBase<mathiu::impl::Pair>::confirm(pIVar1,depth);
  }
  else if (idProcess == kCANCEL) {
    pIVar1 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                        (&local_a,&idPat->mBlock)->super_IdBlockBase<mathiu::impl::Pair>;
    IdBlockBase<mathiu::impl::Pair>::reset(pIVar1,depth);
  }
  return;
}

Assistant:

constexpr static void processIdImpl(Id<Type> const &idPat, int32_t depth,
                                                IdProcess idProcess)
            {
                switch (idProcess)
                {
                case IdProcess::kCANCEL:
                    idPat.reset(depth);
                    break;

                case IdProcess::kCONFIRM:
                    idPat.confirm(depth);
                    break;
                }
            }